

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csmPointCloud.cpp
# Opt level: O3

void __thiscall
csm::ModelBounds::ModelBounds
          (ModelBounds *this,ModelCoord *center,double dim0,double dim1,double dim2)

{
  double dVar1;
  Error *this_00;
  ErrorType local_6c;
  string local_68;
  string local_48;
  
  (this->theCenter).m2 = center->m2;
  dVar1 = center->m1;
  (this->theCenter).m0 = center->m0;
  (this->theCenter).m1 = dVar1;
  (this->theA0).m0 = 1.0;
  (this->theA0).m1 = 0.0;
  (this->theA0).m2 = 0.0;
  (this->theA1).m0 = 0.0;
  (this->theA1).m1 = 1.0;
  (this->theA1).m2 = 0.0;
  (this->theA2).m0 = 0.0;
  (this->theA2).m1 = 0.0;
  (this->theA2).m2 = 1.0;
  this->theDim0 = ABS(dim0);
  this->theDim1 = ABS(dim1);
  this->theDim2 = ABS(dim2);
  if (((dim0 != 0.0) || (NAN(dim0))) && ((dim1 != 0.0 || (NAN(dim1))))) {
    if ((dim2 != 0.0) || (NAN(dim2))) {
      return;
    }
  }
  this_00 = (Error *)__cxa_allocate_exception(0x50);
  local_6c = ILLEGAL_MATH_OPERATION;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"ModelBounds dimension is not a positive value","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"ModelBounds constructor","");
  Error::Error(this_00,&local_6c,&local_68,&local_48);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

ModelBounds::ModelBounds(const ModelCoord& center,
                         double dim0,
                         double dim1,
                         double dim2)
   :
      theCenter (center),
      theA0     (1.0, 0.0, 0.0),
      theA1     (0.0, 1.0, 0.0),
      theA2     (0.0, 0.0, 1.0),
      theDim0   (std::abs(dim0)),
      theDim1   (std::abs(dim1)),
      theDim2   (std::abs(dim2))
{
   // check for errors in dimensions
   if ((theDim0 <= 0.0) || (theDim1 <= 0.0) || (theDim2 <= 0.0))
   {
      throw csm::Error(csm::Error::ILLEGAL_MATH_OPERATION,
                       "ModelBounds dimension is not a positive value",
                       "ModelBounds constructor");
   }
}